

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int imcomp_copy_imheader(fitsfile *infptr,fitsfile *outfptr,int *status)

{
  int iVar1;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  char local_88 [8];
  char card [81];
  int keyclass;
  int ii;
  int nkeys;
  int *status_local;
  fitsfile *outfptr_local;
  fitsfile *infptr_local;
  
  if (*status < 1) {
    _ii = status;
    status_local = &outfptr->HDUposition;
    outfptr_local = infptr;
    ffghsp(infptr,&keyclass,(int *)0x0,status);
    for (stack0xffffffffffffffd0 = 5; stack0xffffffffffffffd0 <= keyclass;
        register0x00000000 = stack0xffffffffffffffd0 + 1) {
      ffgrec(outfptr_local,stack0xffffffffffffffd0,local_88,_ii);
      card._76_4_ = ffgkcl(local_88);
      if ((0x14 < (int)card._76_4_) && (card._76_4_ != 100)) {
        if (local_88[0] < 'D') {
          local_8c = -1;
        }
        else {
          if (local_88[0] < 'E') {
            local_90 = strncmp(local_88,"DATE ",5);
          }
          else {
            local_90 = 1;
          }
          local_8c = local_90;
        }
        if (local_8c == 0) {
          ffpdat((fitsfile *)status_local,_ii);
        }
        else {
          if (local_88[0] < 'E') {
            local_94 = -1;
          }
          else {
            if (local_88[0] < 'F') {
              local_98 = strncmp(local_88,"EXTNAME ",8);
            }
            else {
              local_98 = 1;
            }
            local_94 = local_98;
          }
          if (local_94 == 0) {
            if (((local_88[0] < 'E') || ('E' < local_88[0])) ||
               (iVar1 = strncmp(local_88,"EXTNAME = \'COMPRESSED_IMAGE\'",0x1c), iVar1 != 0)) {
              ffucrd((fitsfile *)status_local,"EXTNAME",local_88,_ii);
            }
          }
          else {
            ffprec((fitsfile *)status_local,local_88,_ii);
          }
        }
        if (0 < *_ii) {
          return *_ii;
        }
      }
    }
    infptr_local._4_4_ = *_ii;
  }
  else {
    infptr_local._4_4_ = *status;
  }
  return infptr_local._4_4_;
}

Assistant:

int imcomp_copy_imheader(fitsfile *infptr, fitsfile *outfptr, int *status)
/*
    This routine reads the header keywords from the input image and
    copies them to the output image;  the manditory structural keywords
    and the checksum keywords are not copied. If the DATE keyword is copied,
    then it is updated with the current date and time.
*/
{
    int nkeys, ii, keyclass;
    char card[FLEN_CARD];	/* a header record */

    if (*status > 0)
        return(*status);

    ffghsp(infptr, &nkeys, NULL, status); /* get number of keywords in image */

    for (ii = 5; ii <= nkeys; ii++)  /* skip the first 4 keywords */
    {
        ffgrec(infptr, ii, card, status);

	keyclass = ffgkcl(card);  /* Get the type/class of keyword */

        /* don't copy structural keywords or checksum keywords */
        if ((keyclass <= TYP_CMPRS_KEY) || (keyclass == TYP_CKSUM_KEY))
	    continue;

        if (FSTRNCMP(card, "DATE ", 5) == 0) /* write current date */
        {
            ffpdat(outfptr, status);
        }
        else if (FSTRNCMP(card, "EXTNAME ", 8) == 0) 
        {
            /* don't copy default EXTNAME keyword from a compressed image */
            if (FSTRNCMP(card, "EXTNAME = 'COMPRESSED_IMAGE'", 28))
            {
                /* if EXTNAME keyword already exists, overwrite it */
                /* otherwise append a new EXTNAME keyword */
                ffucrd(outfptr, "EXTNAME", card, status);
            }
        }
        else
        {
            /* just copy the keyword to the output header */
	    ffprec (outfptr, card, status);
        }

        if (*status > 0)
           return (*status);
    }
    return (*status);
}